

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_paged_audio_buffer_data_uninit
               (ma_paged_audio_buffer_data *pData,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_paged_audio_buffer_page *pmVar1;
  ma_paged_audio_buffer_page *p;
  
  if (pData != (ma_paged_audio_buffer_data *)0x0) {
    p = (pData->head).pNext;
    while (p != (ma_paged_audio_buffer_page *)0x0) {
      pmVar1 = p->pNext;
      ma_free(p,pAllocationCallbacks);
      p = pmVar1;
    }
  }
  return;
}

Assistant:

MA_API void ma_paged_audio_buffer_data_uninit(ma_paged_audio_buffer_data* pData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_paged_audio_buffer_page* pPage;

    if (pData == NULL) {
        return;
    }

    /* All pages need to be freed. */
    pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pData->head.pNext);
    while (pPage != NULL) {
        ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext);

        ma_free(pPage, pAllocationCallbacks);
        pPage = pNext;
    }
}